

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

void __thiscall OpenMD::Stats::collectStats(Stats *this)

{
  BaseAccumulator *pBVar1;
  double dVar2;
  long *plVar3;
  VectorAccumulator *this_00;
  MatrixAccumulator *this_01;
  PotVecAccumulator *this_02;
  long lVar4;
  ulong uVar5;
  Snapshot *this_03;
  double (*padVar6) [3];
  uint uVar7;
  double dVar8;
  ulong uVar9;
  bool bVar10;
  Thermo thermo;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> Jc;
  Thermo local_d0;
  double local_c8;
  Mat3x3d local_c0;
  Snapshot *local_78;
  double local_70;
  potVec local_68;
  
  local_d0.info_ = this->info_;
  this_03 = (local_d0.info_)->sman_->currentSnapshot_;
  dVar8 = 0.0;
  do {
    padVar6 = (double (*) [3])
              (local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1] + 1)
    ;
    if (((this->statsMask_).super__Base_bitset<1UL>._M_w >> ((ulong)dVar8 & 0x3f) & 1) == 0)
    goto switchD_00208f0d_caseD_23;
    switch((ulong)dVar8 & 0xffffffff) {
    case 0:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getTime(this_03);
      break;
    case 1:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getTotalEnergy(&local_d0);
      break;
    case 2:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getPotential(&local_d0);
      break;
    case 3:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getKinetic(&local_d0);
      break;
    case 4:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getTemperature(&local_d0);
      break;
    case 5:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getPressure(&local_d0);
      break;
    case 6:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getVolume(&local_d0);
      break;
    case 7:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getHullVolume(&local_d0);
      break;
    case 8:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getGyrationalVolume(&local_d0);
      break;
    case 9:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getConservedQuantity(this_03);
      break;
    case 10:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getTranslationalKinetic(&local_d0);
      break;
    case 0xb:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getRotationalKinetic(&local_d0);
      break;
    case 0xc:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getElectronicKinetic(&local_d0);
      break;
    case 0xd:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getLongRangePotential(this_03);
      break;
    case 0xe:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&local_c0,this_03);
      lVar4 = *plVar3;
      padVar6 = (double (*) [3])
                (local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
                1);
      goto LAB_00209d69;
    case 0xf:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&local_c0,this_03);
      local_c8 = local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
      ;
      Snapshot::getSelfPotentials(&local_68,this_03);
      local_70 = local_c8 + local_68.data_[2];
      goto LAB_00209d1f;
    case 0x10:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getSelfPotentials((potVec *)&local_c0,this_03);
      local_c8 = local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]
      ;
      Snapshot::getLongRangePotentials(&local_68,this_03);
      local_70 = local_c8 + local_68.data_[4];
LAB_00209d1f:
      (**(code **)(*plVar3 + 0x20))(plVar3);
      goto switchD_00208f0d_caseD_23;
    case 0x11:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getSelfPotentials((potVec *)&local_c0,this_03);
      lVar4 = *plVar3;
      padVar6 = local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ + 1;
      goto LAB_00209d69;
    case 0x12:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&local_c0,this_03);
      lVar4 = *plVar3;
      goto LAB_00209d69;
    case 0x13:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&local_c0,this_03);
      lVar4 = *plVar3;
      padVar6 = (double (*) [3])
                (local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1] +
                2);
      goto LAB_00209d69;
    case 0x14:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getReciprocalPotential(this_03);
      break;
    case 0x15:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getSurfacePotential(this_03);
      break;
    case 0x16:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getShortRangePotential(this_03);
      break;
    case 0x17:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getBondPotential(this_03);
      break;
    case 0x18:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getBendPotential(this_03);
      break;
    case 0x19:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getTorsionPotential(this_03);
      break;
    case 0x1a:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getInversionPotential(this_03);
      break;
    case 0x1b:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getRawPotential(this_03);
      break;
    case 0x1c:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getRestraintPotential(this_03);
      break;
    case 0x1d:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Snapshot::getExcludedPotential(this_03);
      break;
    case 0x1e:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (MatrixAccumulator *)0x0;
      }
      else {
        this_01 = (MatrixAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
      }
      Thermo::getPressureTensor(&local_c0,&local_d0);
      goto LAB_00209c41;
    case 0x1f:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (MatrixAccumulator *)0x0;
      }
      else {
        this_01 = (MatrixAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
      }
      Snapshot::getVirialTensor(&local_c0,this_03);
      goto LAB_00209c41;
    case 0x20:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_00 = (VectorAccumulator *)0x0;
      }
      else {
        this_00 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getSystemDipole((Vector3d *)&local_c0,&local_d0);
      goto LAB_00209d83;
    case 0x21:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (MatrixAccumulator *)0x0;
      }
      else {
        this_01 = (MatrixAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
      }
      Thermo::getSystemQuadrupole(&local_c0,&local_d0);
LAB_00209c41:
      MatrixAccumulator::add(this_01,&local_c0);
      goto switchD_00208f0d_caseD_23;
    case 0x22:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getTaggedAtomPairDistance(&local_d0);
      break;
    default:
      goto switchD_00208f0d_caseD_23;
    case 0x25:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_00 = (VectorAccumulator *)0x0;
      }
      else {
        this_00 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getHeatFlux((Vector3d *)&local_c0,&local_d0);
      goto LAB_00209d83;
    case 0x26:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getElectronicTemperature(&local_d0);
      break;
    case 0x27:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_00 = (VectorAccumulator *)0x0;
      }
      else {
        this_00 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getCom((Vector3d *)&local_c0,&local_d0);
      goto LAB_00209d83;
    case 0x28:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_00 = (VectorAccumulator *)0x0;
      }
      else {
        this_00 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getComVel((Vector3d *)&local_c0,&local_d0);
      goto LAB_00209d83;
    case 0x29:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_00 = (VectorAccumulator *)0x0;
      }
      else {
        this_00 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getAngularMomentum((Vector3d *)&local_c0,&local_d0);
LAB_00209d83:
      VectorAccumulator::add(this_00,(ElementType *)&local_c0);
      goto switchD_00208f0d_caseD_23;
    case 0x2a:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_02 = (PotVecAccumulator *)0x0;
      }
      else {
        this_02 = (PotVecAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
      }
      Thermo::getSelectionPotentials((potVec *)&local_c0,&local_d0);
      PotVecAccumulator::add(this_02,(ElementType *)&local_c0);
      goto switchD_00208f0d_caseD_23;
    case 0x2b:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getNetCharge(&local_d0);
      break;
    case 0x2c:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)dVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           Thermo::getChargeMomentum(&local_d0);
      break;
    case 0x2d:
      local_c8 = dVar8;
      Thermo::getCurrentDensity
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 &local_c0,&local_d0);
      local_78 = this_03;
      if (local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] !=
          local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]) {
        uVar7 = 1;
        uVar5 = 0;
        uVar9 = 1;
        do {
          dVar2 = local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0];
          dVar8 = local_c8;
          plVar3 = (long *)__dynamic_cast(*(undefined8 *)
                                           (*(long *)&(this->data_).
                                                                                                            
                                                  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)local_c8].accumulatorArray2d.
                                                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                                  ._M_impl + (ulong)(uVar7 - 1) * 8),
                                          &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
          (**(code **)(*plVar3 + 0x20))(plVar3,(void *)((long)dVar2 + uVar5 * 0x18));
          plVar3 = (long *)__dynamic_cast(*(undefined8 *)
                                           (*(long *)&(this->data_).
                                                                                                            
                                                  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)dVar8].accumulatorArray2d.
                                                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                                  ._M_impl + (ulong)uVar7 * 8),
                                          &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
          (**(code **)(*plVar3 + 0x20))
                    (plVar3,(long)local_c0.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0] + uVar5 * 0x18 + 8);
          plVar3 = (long *)__dynamic_cast(*(undefined8 *)
                                           (*(long *)&(this->data_).
                                                                                                            
                                                  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)dVar8].accumulatorArray2d.
                                                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                                  ._M_impl + (ulong)(uVar7 + 1) * 8),
                                          &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
          (**(code **)(*plVar3 + 0x20))
                    (plVar3,(long)local_c0.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0] + uVar5 * 0x18 + 0x10
                    );
          uVar5 = ((long)local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][1] -
                   (long)local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][0] >> 3) * -0x5555555555555555;
          uVar7 = uVar7 + 3;
          bVar10 = uVar9 <= uVar5;
          lVar4 = uVar5 - uVar9;
          uVar5 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar10 && lVar4 != 0);
      }
      this_03 = local_78;
      dVar8 = local_c8;
      if ((void *)local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0] != (void *)0x0) {
        operator_delete((void *)local_c0.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0],
                        (long)local_c0.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][2] -
                        (long)local_c0.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][0]);
        dVar8 = local_c8;
      }
      goto switchD_00208f0d_caseD_23;
    }
    padVar6 = (double (*) [3])&local_c0;
    lVar4 = *plVar3;
LAB_00209d69:
    (**(code **)(lVar4 + 0x20))(plVar3,padVar6);
switchD_00208f0d_caseD_23:
    dVar8 = (double)((long)dVar8 + 1);
    if (dVar8 == 2.27270197086973e-322) {
      return;
    }
  } while( true );
}

Assistant:

void Stats::collectStats() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Thermo thermo(info_);

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i]) {
        switch (i) {
        case TIME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getTime());
          break;
        case KINETIC_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getKinetic());
          break;
        case POTENTIAL_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getPotential());
          break;
        case TOTAL_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTotalEnergy());
          break;
        case TEMPERATURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTemperature());
          break;
        case PRESSURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getPressure());
          break;
        case VOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getVolume());
          break;
        case CONSERVED_QUANTITY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getConservedQuantity());
          break;
        case PRESSURE_TENSOR:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(thermo.getPressureTensor());
          break;
          // virial Tensor
        case VIRIAL_TENSOR:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(snap->getVirialTensor());
          break;

        case SYSTEM_DIPOLE:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSystemDipole());
          break;
        case SYSTEM_QUADRUPOLE:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSystemQuadrupole());
          break;
        case HEATFLUX:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getHeatFlux());
          break;
        case HULLVOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getHullVolume());
          break;
        case GYRVOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getGyrationalVolume());
          break;
        case TRANSLATIONAL_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTranslationalKinetic());
          break;
        case ROTATIONAL_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getRotationalKinetic());
          break;
        case ELECTRONIC_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getElectronicKinetic());
          break;
        case LONG_RANGE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotential());
          break;
        case VANDERWAALS_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[VANDERWAALS_FAMILY]);
          break;
        case ELECTROSTATIC_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[ELECTROSTATIC_FAMILY] +
                    snap->getSelfPotentials()[ELECTROSTATIC_FAMILY]);
          break;
        case METALLIC_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSelfPotentials()[METALLIC_EMBEDDING_FAMILY] +
                    snap->getLongRangePotentials()[METALLIC_PAIR_FAMILY]);
          break;
        case METALLIC_EMBEDDING:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSelfPotentials()[METALLIC_EMBEDDING_FAMILY]);
          break;
        case METALLIC_PAIR:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[METALLIC_PAIR_FAMILY]);
          break;
        case HYDROGENBONDING_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[HYDROGENBONDING_FAMILY]);
          break;
        case RECIPROCAL_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getReciprocalPotential());
          break;
        case SURFACE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSurfacePotential());
          break;
        case SHORT_RANGE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getShortRangePotential());
          break;
        case BOND_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getBondPotential());
          break;
        case BEND_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getBendPotential());
          break;
        case DIHEDRAL_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getTorsionPotential());
          break;
        case INVERSION_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getInversionPotential());
          break;
        case RAW_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getRawPotential());
          break;
        case RESTRAINT_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getRestraintPotential());
          break;
        case EXCLUDED_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getExcludedPotential());
          break;
        case TAGGED_PAIR_DISTANCE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTaggedAtomPairDistance());
          break;
        case ELECTRONIC_TEMPERATURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getElectronicTemperature());
          break;
        case COM:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getCom());
          break;
        case COM_VELOCITY:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getComVel());
          break;
        case ANGULAR_MOMENTUM:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getAngularMomentum());
          break;
        case POTENTIAL_SELECTION:
          dynamic_cast<PotVecAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSelectionPotentials());
          break;
        case NET_CHARGE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getNetCharge());
          break;
        case CHARGE_MOMENTUM:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getChargeMomentum());
          break;
        case CURRENT_DENSITY:
          unsigned int k           = 0;
          std::vector<Vector3d> Jc = thermo.getCurrentDensity();
          for (unsigned int j = 0; j < Jc.size(); ++j) {
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][0]);
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][1]);
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][2]);
          }
          break;

          /*
            case SHADOWH:
            dynamic_cast<Accumulator
            *>(data_[i].accumulator)->add(thermo.getShadowHamiltionian());
            break; case HELFANDMOMENT: dynamic_cast<Accumulator
            *>(data_[i].accumulator)->add(thermo.getHelfandMoment()); break;
          */
        }
      }
    }
  }